

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O0

int set_reasons(ASN1_BIT_STRING **preas,char *value)

{
  int iVar1;
  stack_st_CONF_VALUE *sk;
  char *pcVar2;
  CONF_VALUE *pCVar3;
  ASN1_BIT_STRING *pAVar4;
  BIT_STRING_BITNAME *local_48;
  BIT_STRING_BITNAME *pbn;
  char *bnam;
  size_t i;
  stack_st_CONF_VALUE *rsk;
  int ret;
  char *value_local;
  ASN1_BIT_STRING **preas_local;
  
  if (*preas == (ASN1_BIT_STRING *)0x0) {
    rsk._4_4_ = 0;
    sk = (stack_st_CONF_VALUE *)X509V3_parse_list(value);
    if (sk == (stack_st_CONF_VALUE *)0x0) {
      preas_local._4_4_ = 0;
    }
    else {
      for (bnam = (char *)0x0; pcVar2 = (char *)sk_CONF_VALUE_num(sk), bnam < pcVar2;
          bnam = bnam + 1) {
        pCVar3 = sk_CONF_VALUE_value(sk,(size_t)bnam);
        pcVar2 = pCVar3->name;
        if (*preas == (ASN1_BIT_STRING *)0x0) {
          pAVar4 = ASN1_BIT_STRING_new();
          *preas = (ASN1_BIT_STRING *)pAVar4;
          if (*preas == (ASN1_BIT_STRING *)0x0) goto LAB_002e7d46;
        }
        for (local_48 = reason_flags; local_48->lname != (char *)0x0; local_48 = local_48 + 1) {
          iVar1 = strcmp(local_48->sname,pcVar2);
          if (iVar1 == 0) {
            iVar1 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)*preas,local_48->bitnum,1);
            if (iVar1 == 0) goto LAB_002e7d46;
            break;
          }
        }
        if (local_48->lname == (char *)0x0) goto LAB_002e7d46;
      }
      rsk._4_4_ = 1;
LAB_002e7d46:
      sk_CONF_VALUE_pop_free(sk,X509V3_conf_free);
      preas_local._4_4_ = rsk._4_4_;
    }
  }
  else {
    ERR_put_error(0x14,0,0xa3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                  ,0xb3);
    preas_local._4_4_ = 0;
  }
  return preas_local._4_4_;
}

Assistant:

static int set_reasons(ASN1_BIT_STRING **preas, const char *value) {
  if (*preas) {
    // Duplicate "reasons" or "onlysomereasons" key.
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_VALUE);
    return 0;
  }
  int ret = 0;
  STACK_OF(CONF_VALUE) *rsk = X509V3_parse_list(value);
  if (!rsk) {
    return 0;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(rsk); i++) {
    const char *bnam = sk_CONF_VALUE_value(rsk, i)->name;
    if (!*preas) {
      *preas = ASN1_BIT_STRING_new();
      if (!*preas) {
        goto err;
      }
    }
    const BIT_STRING_BITNAME *pbn;
    for (pbn = reason_flags; pbn->lname; pbn++) {
      if (!strcmp(pbn->sname, bnam)) {
        if (!ASN1_BIT_STRING_set_bit(*preas, pbn->bitnum, 1)) {
          goto err;
        }
        break;
      }
    }
    if (!pbn->lname) {
      goto err;
    }
  }
  ret = 1;

err:
  sk_CONF_VALUE_pop_free(rsk, X509V3_conf_free);
  return ret;
}